

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O2

TRef fori_load(jit_State *J,BCReg slot,IRType t,int mode)

{
  TRef TVar1;
  int iVar2;
  
  iVar2 = 0x80;
  if ((mode & 4U) == 0) {
    iVar2 = (uint)((uint)mode < 0x10000 && t == IRT_INT) << 7;
  }
  TVar1 = sloadt(J,slot,t + iVar2,mode + (uint)(t == IRT_INT) * 8);
  return TVar1;
}

Assistant:

static TRef fori_load(jit_State *J, BCReg slot, IRType t, int mode)
{
  int conv = (tvisint(&J->L->base[slot]) != (t==IRT_INT)) ? IRSLOAD_CONVERT : 0;
  return sloadt(J, (int32_t)slot,
		t + (((mode & IRSLOAD_TYPECHECK) ||
		      (conv && t == IRT_INT && !(mode >> 16))) ?
		     IRT_GUARD : 0),
		mode + conv);
}